

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::DataParameter::SerializeWithCachedSizes(DataParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  string *psVar2;
  void *pvVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->source_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.DataParameter.source");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (1,(this->source_).ptr_,output);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteFloat(2,this->scale_,output);
  }
  if ((uVar1 & 2) != 0) {
    psVar2 = (this->mean_file_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.DataParameter.mean_file");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (3,(this->mean_file_).ptr_,output);
  }
  if ((uVar1 & 4) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(4,this->batch_size_,output);
  }
  if ((uVar1 & 8) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(5,this->crop_size_,output);
  }
  if ((uVar1 & 0x20) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(6,this->mirror_,output);
  }
  if ((uVar1 & 0x10) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(7,this->rand_skip_,output);
  }
  if ((char)uVar1 < '\0') {
    google::protobuf::internal::WireFormatLite::WriteEnum(8,this->backend_,output);
  }
  if ((uVar1 & 0x40) != 0) {
    google::protobuf::internal::WireFormatLite::WriteBool(9,this->force_encoded_color_,output);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(10,this->prefetch_,output);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    return;
  }
  google::protobuf::internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void DataParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.DataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string source = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.DataParameter.source");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->source(), output);
  }

  // optional float scale = 2 [default = 1];
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->scale(), output);
  }

  // optional string mean_file = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.DataParameter.mean_file");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->mean_file(), output);
  }

  // optional uint32 batch_size = 4;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(4, this->batch_size(), output);
  }

  // optional uint32 crop_size = 5 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(5, this->crop_size(), output);
  }

  // optional bool mirror = 6 [default = false];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(6, this->mirror(), output);
  }

  // optional uint32 rand_skip = 7 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(7, this->rand_skip(), output);
  }

  // optional .caffe.DataParameter.DB backend = 8 [default = LEVELDB];
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      8, this->backend(), output);
  }

  // optional bool force_encoded_color = 9 [default = false];
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(9, this->force_encoded_color(), output);
  }

  // optional uint32 prefetch = 10 [default = 4];
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(10, this->prefetch(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.DataParameter)
}